

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O3

long vec3::random(void)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar5;
  
  dVar5 = in_XMM1_Qa - (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  iVar2 = rand();
  iVar3 = rand();
  iVar4 = rand();
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *in_RDI = dVar1 + dVar5 * (double)iVar2 * 4.656612873077393e-10;
  in_RDI[1] = dVar1 + dVar5 * (double)iVar3 * 4.656612873077393e-10;
  in_RDI[2] = (double)iVar4 * 4.656612873077393e-10 * dVar5 + dVar1;
  return (long)in_RDI;
}

Assistant:

static vec3 random(double min, double max) {
        return vec3(random_double(min,max), random_double(min,max), random_double(min,max));
    }